

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O3

Solution * ConstructionHeuristics::RequestsFirst(Solution *solution)

{
  Turn *this;
  pointer pcVar1;
  size_t sVar2;
  pointer pSVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  result_type rVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar11;
  Scenario *pSVar12;
  WeekData *pWVar13;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *__x;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar14;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  string *psVar15;
  const_iterator cVar16;
  ShiftType *pSVar17;
  const_iterator cVar18;
  _Base_ptr p_Var19;
  Nurse *this_01;
  string *psVar20;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  __first;
  uint uVar21;
  long lVar22;
  pointer __x_00;
  int iVar23;
  pointer ppTVar24;
  pointer pSVar25;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> shiftOffRequests;
  ShiftOffRequest shiftOffRequest;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  type random;
  ulong local_118;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> local_108;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  vector<Turn_*,_std::allocator<Turn_*>_> local_70;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  param_type local_40;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  uVar5 = std::chrono::_V2::system_clock::now();
  uVar21 = uVar5 / 0x7fffffff << 0x1f | uVar5 / 0x7fffffff;
  pmVar11 = Solution::getNurses_abi_cxx11_(solution);
  local_40 = (param_type)
             (((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count << 0x20) + -0x100000000);
  local_38._M_x = (ulong)(uVar21 + uVar5 + (uint)(uVar5 + uVar21 == 0));
  pSVar12 = Scenario::getInstance();
  pWVar13 = Scenario::getWeekData(pSVar12);
  __x = WeekData::getShiftOffRequests(pWVar13);
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::vector(&local_108,__x);
  pvVar14 = Solution::getTurns(solution);
  __x_00 = (pvVar14->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pvVar14->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != local_58) {
    do {
      std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&local_70,__x_00);
      local_50 = local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppTVar24 = local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar4 = true;
      }
      else {
        do {
          this = *ppTVar24;
          pSVar12 = Scenario::getInstance();
          pWVar13 = Scenario::getWeekData(pSVar12);
          this_00 = &WeekData::getRequirements_abi_cxx11_(pWVar13)->_M_h;
          psVar15 = Turn::getSkill_abi_cxx11_(this);
          cVar16 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,psVar15);
          if (cVar16.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
LAB_0011982e:
            std::__throw_out_of_range("_Map_base::at");
LAB_0011983a:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          pSVar17 = Turn::getShiftType(this);
          psVar15 = ShiftType::getId_abi_cxx11_(pSVar17);
          cVar18 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((long)cVar16.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                                    ._M_cur + 0x28),psVar15);
          if (cVar18.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_0011982e;
          uVar5 = Turn::getDay(this);
          if ((ulong)(*(long *)((long)cVar18.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x30) -
                      *(long *)((long)cVar18.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x28) >> 3) <= (ulong)uVar5) goto LAB_0011983a;
          iVar6 = DayRequirement::getMinimumCoverage
                            (*(DayRequirement **)
                              (*(long *)((long)cVar18.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                               ._M_cur + 0x28) + (ulong)uVar5 * 8));
          local_48 = ppTVar24;
          if (0 < iVar6) {
            local_118 = 0;
            iVar23 = 0;
            do {
              pmVar11 = Solution::getNurses_abi_cxx11_(solution);
              p_Var19 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              rVar7 = std::uniform_int_distribution<int>::operator()
                                ((uniform_int_distribution<int> *)&local_40,&local_38,&local_40);
              lVar22 = (long)rVar7;
              if (rVar7 < 1) {
                if (rVar7 != 0) {
                  do {
                    p_Var19 = (_Base_ptr)std::_Rb_tree_decrement(p_Var19);
                    lVar22 = lVar22 + 1;
                  } while (lVar22 != 0);
                }
              }
              else {
                do {
                  p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
                  lVar22 = lVar22 + -1;
                } while (lVar22 != 0);
              }
              pSVar3 = local_108.
                       super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              if (local_108.super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_108.super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_00119758:
                bVar4 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(p_Var19 + 2),this);
                pmVar11 = Solution::getNurses_abi_cxx11_(solution);
                if ((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 2 <= local_118) {
                  bVar4 = false;
                  goto LAB_001197ce;
                }
                iVar10 = bVar4 - 1;
              }
              else {
                bVar4 = false;
                pSVar25 = local_108.
                          super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  local_f0[0] = local_e0;
                  pcVar1 = (pSVar25->nurse)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_f0,pcVar1,pcVar1 + (pSVar25->nurse)._M_string_length);
                  local_d0[0] = local_c0;
                  pcVar1 = (pSVar25->shiftType)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_d0,pcVar1,
                             pcVar1 + (pSVar25->shiftType)._M_string_length);
                  local_b0[0] = local_a0;
                  pcVar1 = (pSVar25->day)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_b0,pcVar1,pcVar1 + (pSVar25->day)._M_string_length);
                  psVar15 = ShiftOffRequest::getNurse_abi_cxx11_((ShiftOffRequest *)local_f0);
                  this_01 = NurseSolution::getNurse(*(NurseSolution **)(p_Var19 + 2));
                  psVar20 = Nurse::getId_abi_cxx11_(this_01);
                  sVar2 = psVar15->_M_string_length;
                  if ((sVar2 != psVar20->_M_string_length) ||
                     ((iVar10 = 0xb, sVar2 != 0 &&
                      (iVar8 = bcmp((psVar15->_M_dataplus)._M_p,(psVar20->_M_dataplus)._M_p,sVar2),
                      iVar8 != 0)))) {
                    pSVar12 = Scenario::getInstance();
                    psVar15 = ShiftOffRequest::getDay_abi_cxx11_((ShiftOffRequest *)local_f0);
                    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                    pcVar1 = (psVar15->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_90,pcVar1,pcVar1 + psVar15->_M_string_length);
                    iVar8 = Scenario::getDayOfWeek(pSVar12,&local_90);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    iVar9 = Turn::getDay(this);
                    iVar10 = 0;
                    if (iVar9 == iVar8) {
                      psVar15 = ShiftOffRequest::getShiftType_abi_cxx11_
                                          ((ShiftOffRequest *)local_f0);
                      iVar8 = std::__cxx11::string::compare((char *)psVar15);
                      if (iVar8 != 0) {
                        psVar15 = ShiftOffRequest::getShiftType_abi_cxx11_
                                            ((ShiftOffRequest *)local_f0);
                        pSVar17 = Turn::getShiftType(this);
                        psVar20 = ShiftType::getId_abi_cxx11_(pSVar17);
                        sVar2 = psVar15->_M_string_length;
                        if ((sVar2 != psVar20->_M_string_length) ||
                           ((sVar2 != 0 &&
                            (iVar8 = bcmp((psVar15->_M_dataplus)._M_p,(psVar20->_M_dataplus)._M_p,
                                          sVar2), iVar8 != 0)))) goto LAB_001196c9;
                      }
                      __first = std::
                                __remove_if<__gnu_cxx::__normal_iterator<ShiftOffRequest*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>,__gnu_cxx::__ops::_Iter_equals_val<ShiftOffRequest_const>>
                                          ((__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                            )local_108.
                                             super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                           (__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                            )local_108.
                                             super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,
                                           (ShiftOffRequest *)local_f0);
                      std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::_M_erase
                                (&local_108,(iterator)__first._M_current,
                                 (iterator)
                                 local_108.
                                 super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                      iVar10 = 10;
                      bVar4 = true;
                    }
                  }
LAB_001196c9:
                  if (local_b0[0] != local_a0) {
                    operator_delete(local_b0[0],local_a0[0] + 1);
                  }
                  if (local_d0[0] != local_c0) {
                    operator_delete(local_d0[0],local_c0[0] + 1);
                  }
                  if (local_f0[0] != local_e0) {
                    operator_delete(local_f0[0],local_e0[0] + 1);
                  }
                } while (((iVar10 == 0xb) || (iVar10 == 0)) &&
                        (pSVar25 = pSVar25 + 1, pSVar25 != pSVar3));
                iVar10 = -1;
                if (!bVar4) goto LAB_00119758;
              }
              local_118 = local_118 + 1;
              iVar23 = iVar23 + iVar10 + 1;
            } while (iVar23 < iVar6);
          }
          ppTVar24 = local_48 + 1;
        } while (ppTVar24 != local_50);
        bVar4 = true;
      }
LAB_001197ce:
      if (local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar4) {
        solution = (Solution *)0x0;
        break;
      }
      __x_00 = __x_00 + 1;
    } while (__x_00 != local_58);
  }
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::~vector(&local_108);
  return solution;
}

Assistant:

Solution* ConstructionHeuristics::RequestsFirst(Solution* solution){
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    vector<ShiftOffRequest> shiftOffRequests = Scenario::getInstance()->getWeekData().getShiftOffRequests();


    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            outerLoop: for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                //check if nurse requested day off
                bool cont = false;

                for(ShiftOffRequest shiftOffRequest: shiftOffRequests) {
                    if(shiftOffRequest.getNurse() == iter->second->getNurse()->getId())
                        continue;
                    int dayInt = Scenario::getInstance()->getDayOfWeek(shiftOffRequest.getDay());
                    if(turn->getDay() == dayInt && (shiftOffRequest.getShiftType() == "Any" || shiftOffRequest.getShiftType() == turn->getShiftType()->getId())) {
                        cont = true;
                        shiftOffRequests.erase(std::remove(shiftOffRequests.begin(), shiftOffRequests.end(), shiftOffRequest), shiftOffRequests.end());
                        break;
                    }
                }
                if(cont){
                    i--;
                    continue;
                }
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}